

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error open_face_from_buffer
                   (FT_Library library,FT_Byte *base,FT_ULong size,FT_Long face_index,
                   char *driver_name,FT_Face *aface)

{
  FT_Memory pFVar1;
  FT_Stream pFVar2;
  FT_Error FVar3;
  FT_Open_Args args;
  FT_Open_Args local_70;
  
  pFVar1 = library->memory;
  local_70.flags = 0;
  if (driver_name != (char *)0x0) {
    local_70.driver = FT_Get_Module(library,driver_name);
    if (local_70.driver == (FT_Module)0x0) {
      FVar3 = 0xb;
      goto LAB_0021d8d9;
    }
    local_70.flags = 8;
  }
  if (base == (FT_Byte *)0x0) {
    FVar3 = 6;
  }
  else {
    local_70.stream = (FT_Stream)0x0;
    pFVar2 = (FT_Stream)(*pFVar1->alloc)(pFVar1,0x50);
    FVar3 = (uint)(pFVar2 == (FT_Stream)0x0) << 6;
    if (pFVar2 != (FT_Stream)0x0) {
      pFVar2->base = (uchar *)0x0;
      pFVar2->size = 0;
      pFVar2->pos = 0;
      (pFVar2->descriptor).value = 0;
      pFVar2->cursor = (uchar *)0x0;
      pFVar2->limit = (uchar *)0x0;
      pFVar2->close = (FT_Stream_CloseFunc)0x0;
      pFVar2->memory = (FT_Memory)0x0;
      (pFVar2->pathname).value = 0;
      pFVar2->read = (FT_Stream_IoFunc)0x0;
      pFVar2->base = base;
      pFVar2->size = size;
      pFVar2->pos = 0;
      pFVar2->cursor = (uchar *)0x0;
      pFVar2->read = (FT_Stream_IoFunc)0x0;
      pFVar2->close = (FT_Stream_CloseFunc)0x0;
      (pFVar2->descriptor).value = (long)pFVar1;
      pFVar2->close = memory_stream_close;
      local_70.stream = pFVar2;
    }
  }
  if (FVar3 == 0) {
    local_70.flags = local_70.flags | 2;
    FVar3 = ft_open_face_internal(library,&local_70,face_index,aface,'\0');
    return FVar3;
  }
LAB_0021d8d9:
  if (base != (FT_Byte *)0x0) {
    (*pFVar1->free)(pFVar1,base);
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  open_face_from_buffer( FT_Library   library,
                         FT_Byte*     base,
                         FT_ULong     size,
                         FT_Long      face_index,
                         const char*  driver_name,
                         FT_Face     *aface )
  {
    FT_Open_Args  args;
    FT_Error      error;
    FT_Memory     memory = library->memory;


    args.flags = 0;

    if ( driver_name )
    {
      args.driver = FT_Get_Module( library, driver_name );
      if ( !args.driver )
      {
        FT_FREE( base );
        return FT_THROW( Missing_Module );
      }

      args.flags = args.flags | FT_OPEN_DRIVER;
    }

    /* `memory_stream_close` also frees the stream object. */
    error = new_memory_stream( library,
                               base,
                               size,
                               memory_stream_close,
                               &args.stream );
    if ( error )
    {
      FT_FREE( base );
      return error;
    }

    args.flags |= FT_OPEN_STREAM;

#ifdef FT_MACINTOSH
    /* At this point, the face index has served its purpose;  */
    /* whoever calls this function has already used it to     */
    /* locate the correct font data.  We should not propagate */
    /* this index to FT_Open_Face() (unless it is negative).  */

    if ( face_index > 0 )
      face_index &= 0x7FFF0000L; /* retain GX data */
#endif

    return ft_open_face_internal( library, &args, face_index, aface, 0 );
  }